

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O2

void __thiscall
la::LevenshteinNFA::LevenshteinNFA
          (LevenshteinNFA *this,size_t size,int initialstate,
          list<int,_std::allocator<int>_> *finalStates)

{
  ulong in_RAX;
  undefined8 uStack_28;
  
  this->_initialState = initialstate;
  uStack_28 = in_RAX;
  std::__detail::_List_node_header::_List_node_header
            ((_List_node_header *)&this->_finalStates,(_List_node_header *)finalStates);
  (this->_inputs).super__Fwd_list_base<char,_std::allocator<char>_>._M_impl._M_head._M_next =
       (_Fwd_list_node_base *)0x0;
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::vector
            (&this->_transTable,size * size,(value_type *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  this->_size = size;
  return;
}

Assistant:

LevenshteinNFA::LevenshteinNFA(std::size_t size, int initialstate, std::list<int> &&finalStates)
        : _initialState{initialstate},
          _size{size},
          _finalStates{std::move(finalStates)},
          _transTable(size * size, '\0') {}